

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

QList<QTextLength> * __thiscall
QList<QTextLength>::fill(QList<QTextLength> *this,parameter_type t,qsizetype newSize)

{
  bool bVar1;
  qsizetype qVar2;
  QPodArrayOps<QTextLength> *pQVar3;
  QTextLength *b;
  QTextLength *this_00;
  longlong *plVar4;
  DataOps *n;
  parameter_type in_RDX;
  __off_t __length;
  parameter_type in_RSI;
  QArrayDataPointer<QTextLength> *in_RDI;
  long in_FS_OFFSET;
  QTextLength copy;
  DataPointer detached;
  QArrayDataPointer<QTextLength> *in_stack_ffffffffffffff68;
  parameter_type pQVar5;
  QArrayDataPointer<QTextLength> *in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QTextLength> *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffff88;
  QArrayDataPointer<QTextLength> *in_stack_ffffffffffffff90;
  qsizetype local_40;
  undefined8 local_38;
  qreal local_30;
  QArrayDataPointer<QTextLength> local_28;
  parameter_type local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = in_RDX;
  if (in_RDX == (parameter_type)0xffffffffffffffff) {
    local_10 = (parameter_type)size((QList<QTextLength> *)in_RDI);
  }
  QArrayDataPointer<QTextLength>::operator->(in_RDI);
  bVar1 = QArrayDataPointer<QTextLength>::needsDetach(in_stack_ffffffffffffff70);
  pQVar5 = local_10;
  if ((bVar1) || (qVar2 = capacity((QList<QTextLength> *)0x7c0f72), qVar2 < (long)pQVar5)) {
    local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.ptr = (QTextLength *)&DAT_aaaaaaaaaaaaaaaa;
    local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QTextLength>::operator->(in_RDI);
    QArrayDataPointer<QTextLength>::detachCapacity
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QArrayDataPointer<QTextLength>::QArrayDataPointer
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,
               (AllocationOption)((ulong)in_stack_ffffffffffffff78 >> 0x20));
    QArrayDataPointer<QTextLength>::operator->(&local_28);
    QtPrivate::QPodArrayOps<QTextLength>::copyAppend
              ((QPodArrayOps<QTextLength> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (parameter_type)in_stack_ffffffffffffff70);
    QArrayDataPointer<QTextLength>::swap(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    QArrayDataPointer<QTextLength>::~QArrayDataPointer(in_stack_ffffffffffffff70);
  }
  else {
    local_38 = *(undefined8 *)in_RSI;
    local_30 = in_RSI->fixedValueOrPercentage;
    pQVar3 = (QPodArrayOps<QTextLength> *)QArrayDataPointer<QTextLength>::operator->(in_RDI);
    b = QArrayDataPointer<QTextLength>::begin((QArrayDataPointer<QTextLength> *)0x7c105e);
    this_00 = QArrayDataPointer<QTextLength>::begin((QArrayDataPointer<QTextLength> *)0x7c106d);
    local_40 = size((QList<QTextLength> *)in_RDI);
    plVar4 = qMin<long_long>(&local_40,(longlong *)&local_10);
    QtPrivate::QPodArrayOps<QTextLength>::assign(pQVar3,b,this_00 + *plVar4,in_RSI);
    pQVar5 = local_10;
    qVar2 = size((QList<QTextLength> *)in_RDI);
    if (qVar2 < (long)pQVar5) {
      n = QArrayDataPointer<QTextLength>::operator->(in_RDI);
      pQVar5 = local_10;
      size((QList<QTextLength> *)in_RDI);
      QtPrivate::QPodArrayOps<QTextLength>::copyAppend
                ((QPodArrayOps<QTextLength> *)this_00,(qsizetype)n,pQVar5);
    }
    else {
      pQVar5 = local_10;
      qVar2 = size((QList<QTextLength> *)in_RDI);
      if ((long)pQVar5 < qVar2) {
        pQVar3 = (QPodArrayOps<QTextLength> *)QArrayDataPointer<QTextLength>::operator->(in_RDI);
        QtPrivate::QPodArrayOps<QTextLength>::truncate(pQVar3,(char *)local_10,__length);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QList<QTextLength> *)in_RDI;
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}